

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

bool __thiscall Glucose::Solver::enqueue(Solver *this,Lit p,CRef from)

{
  bool bVar1;
  byte bVar2;
  lbool local_2a;
  lbool local_29;
  
  bVar2 = (byte)p.x & 1;
  local_29.value = (this->assigns).data[p.x >> 1].value ^ bVar2;
  bVar1 = lbool::operator!=(&local_29,(lbool)0x2);
  if (bVar1) {
    local_2a.value = bVar2 ^ (this->assigns).data[p.x >> 1].value;
    bVar1 = lbool::operator!=(&local_2a,(lbool)0x1);
  }
  else {
    uncheckedEnqueue(this,p,from);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

inline bool     Solver::enqueue         (Lit p, CRef from)      { return value(p) != l_Undef ? value(p) != l_False : (uncheckedEnqueue(p, from), true); }